

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void Cmd_acsprofile(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  size_t __n;
  size_t sVar6;
  code *sorter;
  long ilimit;
  BYTE *pBVar7;
  TArray<ProfileCollector,_ProfileCollector> FuncProfiles;
  TArray<ProfileCollector,_ProfileCollector> ScriptProfiles;
  char *endptr;
  
  ScriptProfiles.Array = (ProfileCollector *)0x0;
  ScriptProfiles.Most = 0;
  ScriptProfiles.Count = 0;
  FuncProfiles.Array = (ProfileCollector *)0x0;
  FuncProfiles.Most = 0;
  FuncProfiles.Count = 0;
  ArrangeScriptProfiles(&ScriptProfiles);
  ArrangeFunctionProfiles(&FuncProfiles);
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    sorter = sort_by_total_instr;
    ilimit = 10;
LAB_003d5148:
    ShowProfileData(&ScriptProfiles,ilimit,sorter,false);
    ShowProfileData(&FuncProfiles,ilimit,sorter,true);
  }
  else {
    iVar1 = 1;
    pcVar3 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar3,"clear");
    if (iVar2 != 0) {
      sorter = sort_by_total_instr;
      ilimit = 10;
LAB_003d5070:
      iVar2 = FCommandLine::argc(argv);
      if (iVar1 < iVar2) {
        pcVar3 = FCommandLine::operator[](argv,iVar1);
        lVar4 = strtol(pcVar3,&endptr,0);
        pcVar3 = endptr;
        pcVar5 = FCommandLine::operator[](argv,iVar1);
        if (pcVar3 == pcVar5) {
          pcVar3 = FCommandLine::operator[](argv,iVar1);
          __n = strlen(pcVar3);
          pBVar7 = "\x01\x02\x02\x01\x01";
          lVar4 = 0;
          do {
            if (lVar4 == 0x28) {
              pcVar3 = FCommandLine::operator[](argv,iVar1);
              Printf("Unknown option \'%s\'\n",pcVar3);
              Printf("acsprofile clear : Reset profiling information\n");
              Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
              goto LAB_003d51b8;
            }
            if (*pBVar7 <= __n) {
              pcVar3 = *(char **)((long)Cmd_acsprofile::sort_names + lVar4);
              sVar6 = strlen(pcVar3);
              if (__n <= sVar6) {
                pcVar5 = FCommandLine::operator[](argv,iVar1);
                iVar2 = strncasecmp(pcVar5,pcVar3,__n);
                if (iVar2 == 0) goto LAB_003d5128;
              }
            }
            lVar4 = lVar4 + 8;
            pBVar7 = pBVar7 + 1;
          } while( true );
        }
        goto LAB_003d50b5;
      }
      goto LAB_003d5148;
    }
    ClearProfiles(&ScriptProfiles);
    ClearProfiles(&FuncProfiles);
  }
LAB_003d51b8:
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&FuncProfiles);
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&ScriptProfiles);
  return;
LAB_003d5128:
  sorter = *(code **)((long)Cmd_acsprofile::sort_funcs + lVar4);
  lVar4 = ilimit;
LAB_003d50b5:
  iVar1 = iVar1 + 1;
  ilimit = lVar4;
  goto LAB_003d5070;
}

Assistant:

CCMD(acsprofile)
{
	static int (*sort_funcs[])(const void*, const void *) =
	{
		sort_by_total_instr,
		sort_by_min,
		sort_by_max,
		sort_by_avg,
		sort_by_runs
	};
	static const char *sort_names[] = { "total", "min", "max", "avg", "runs" };
	static const BYTE sort_match_len[] = {   1,     2,     2,     1,      1 };

	TArray<ProfileCollector> ScriptProfiles, FuncProfiles;
	long limit = 10;
	int (*sorter)(const void *, const void *) = sort_by_total_instr;

	assert(countof(sort_names) == countof(sort_match_len));

	ArrangeScriptProfiles(ScriptProfiles);
	ArrangeFunctionProfiles(FuncProfiles);

	if (argv.argc() > 1)
	{
		// `acsprofile clear` will zero all profiling information collected so far.
		if (stricmp(argv[1], "clear") == 0)
		{
			ClearProfiles(ScriptProfiles);
			ClearProfiles(FuncProfiles);
			return;
		}
		for (int i = 1; i < argv.argc(); ++i)
		{
			// If it's a number, set the display limit.
			char *endptr;
			long num = strtol(argv[i], &endptr, 0);
			if (endptr != argv[i])
			{
				limit = num;
				continue;
			}
			// If it's a name, set the sort method. We accept partial matches for
			// options that are shorter than the sort name.
			size_t optlen = strlen(argv[i]);
			unsigned int j;
			for (j = 0; j < countof(sort_names); ++j)
			{
				if (optlen < sort_match_len[j] || optlen > strlen(sort_names[j]))
				{ // Too short or long to match.
					continue;
				}
				if (strnicmp(argv[i], sort_names[j], optlen) == 0)
				{
					sorter = sort_funcs[j];
					break;
				}
			}
			if (j == countof(sort_names))
			{
				Printf("Unknown option '%s'\n", argv[i]);
				Printf("acsprofile clear : Reset profiling information\n");
				Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
				return;
			}
		}
	}

	ShowProfileData(ScriptProfiles, limit, sorter, false);
	ShowProfileData(FuncProfiles, limit, sorter, true);
}